

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu_x86.c
# Opt level: O0

ND_BOOL ShemuX86TrackLoop(SHEMU_CONTEXT *Context,ND_BOOL Taken)

{
  ulong Rip;
  ulong Target;
  ND_UINT64 target;
  ND_UINT64 rip;
  ND_BOOL Taken_local;
  SHEMU_CONTEXT *Context_local;
  
  Rip = (Context->Arch).X86.Registers.RegRip - (ulong)*(byte *)((long)&Context->Arch + 0xb);
  Target = (Context->Arch).X86.Registers.RegRip + *(long *)((long)&Context->Arch + 0x48);
  if (Target < Rip) {
    if (Taken == '\0') {
      if (Rip == (Context->LoopTrack).Address) {
        ShemuX86TrackLoopStop(Context);
      }
    }
    else if (Rip == (Context->LoopTrack).Address) {
      (Context->LoopTrack).Iteration = (Context->LoopTrack).Iteration + 1;
    }
    else {
      ShemuX86TrackLoopStop(Context);
      ShemuX86TrackLoopStart(Context,Rip,Target);
    }
  }
  else if ((Taken != '\0') &&
          ((Target < (Context->LoopTrack).Target || ((Context->LoopTrack).Address < Target)))) {
    ShemuX86TrackLoopStop(Context);
  }
  return Taken;
}

Assistant:

static ND_BOOL
ShemuX86TrackLoop(
    SHEMU_CONTEXT *Context,
    ND_BOOL Taken
    )
{
    ND_UINT64 rip, target;

    // The address of the loop instruction itself, not the next instruction.
    rip = Context->Arch.X86.Registers.RegRip - Context->Arch.X86.Instruction.Length;

    // The branches we monitor always have a relative offset, which is the first operand.
    target = Context->Arch.X86.Registers.RegRip + Context->Arch.X86.Instruction.Operands[0].Info.RelativeOffset.Rel;

    if (target < rip)
    {
        // Case 1: Backward branch.
        if (Taken)
        {
            // Taken backward branch instruction.
            if (rip == Context->LoopTrack.Address)
            {
                // Current active loop, this is a new iteration. Example:
                // label1:                  <--+
                //      ...                    |
                //      loop    label1      ---+
                //      ...
                // Update loop information.
                Context->LoopTrack.Iteration++;
            }
            else
            {
                // New loop, or loop within our current loop. Always track the inner most loop. Example:
                // label1:                  <--+
                //      ...                    |
                // label2:              <--+   |
                //      ...                |   |
                //      loop    label2  ---+   |
                //      ...                    |
                //      loop    label1      ---+
                //      ...
                // Start tracking the (potentially new) loop.
                ShemuX86TrackLoopStop(Context);

                ShemuX86TrackLoopStart(Context, rip, target);
            }
        }
        else
        {
            // Not taken backward branch instruction.
            if (rip == Context->LoopTrack.Address)
            {
                // Current loop ends, the loop instruction is no longer taken. Example:
                // label1:
                //      ...
                //      loop    label1      ---+
                //      ...                 <--+
                // Stop tracking.
                ShemuX86TrackLoopStop(Context);
            }
            else
            {
                // Not taken backward branch, but not our current loop.
                // Nothing to do.
            }
        }
    }
    else
    {
        // Case 2: Forward branch.
        if (Taken)
        {
            // Taken forward branch instruction.
            if (target < Context->LoopTrack.Target || target > Context->LoopTrack.Address)
            {
                // Break instruction. Example:
                // label1:
                //      ...
                //      jnz     label2      ---+
                //      ...                    |
                //      loop    label1         |
                //      ...                    |
                // label2:                  <--+
                //      ...
                // Stop tracking.
                ShemuX86TrackLoopStop(Context);
            }
            else
            {
                // If instruction. Example:
                // label1:
                //      ...
                //      jnz     label2      ---+
                //      ...                    |
                // label2:                  <--+
                //      ...
                //      loop    label1
                //      ...
                // Nothing to do.
            }
        }
        else
        {
            // Not taken forward branch instruction.
            // Nothing to do.
        }
    }

    // In theory, we can override whether the branch is taken or not, but for now, this is not used.
    return Taken;
}